

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment)

{
  pointer *out;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  reference ppcVar5;
  string *file2;
  ulong uVar6;
  size_type sVar7;
  SaveRestoreEnvironment *pSVar8;
  cmsysProcess *cp_00;
  reference command;
  reference pcVar9;
  void *pvVar10;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  double dVar11;
  bool local_16a1;
  byte local_160a;
  byte local_15b9;
  string local_15b8 [32];
  undefined1 local_1598 [8];
  ostringstream cmCTestLog_msg_6;
  allocator local_1419;
  string local_1418 [8];
  string outerr_1;
  undefined1 local_13d8 [8];
  ostringstream cmCTestLog_msg_5;
  allocator local_1259;
  string local_1258 [8];
  string outerr;
  string local_1230 [4];
  int result;
  undefined1 local_1210 [8];
  ostringstream cmCTestLog_msg_4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1098;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1090;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1088;
  string local_1080 [32];
  cmCTestLogWrite local_1060;
  undefined1 local_1050 [8];
  ostringstream cmCTestLog_msg_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_ed0;
  const_iterator local_ec8;
  int local_ebc;
  char *pcStack_eb8;
  int length;
  char *data;
  undefined1 local_e90 [8];
  ostringstream cmCTestLog_msg_2;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_d18;
  cmsysProcess *local_d10;
  cmsysProcess *cp;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  undefined1 local_cc8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_b50 [32];
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> local_b30;
  auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv_1;
  string oldpath;
  value_type local_b00;
  value_type local_ae0;
  ostringstream local_ac0 [8];
  ostringstream msg;
  allocator local_941;
  value_type local_940;
  uint local_91c;
  undefined1 local_918 [4];
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream oss;
  undefined1 local_788 [8];
  cmCTest inst;
  string local_220;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream cmCTestLog_msg;
  double local_58;
  double timeout;
  bool modifyEnv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  double testTimeOut_local;
  ostream *log_local;
  int *retVal_local;
  string *output_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *argv_local;
  cmCTest *this_local;
  
  local_15b9 = 0;
  if (environment !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(environment);
    local_15b9 = bVar1 ^ 0xff;
  }
  local_58 = GetRemainingTimeAllowed(this);
  local_58 = local_58 - 120.0;
  if ((0.0 < this->TimeOut) && (this->TimeOut < local_58)) {
    local_58 = this->TimeOut;
  }
  if ((0.0 < testTimeOut) && (dVar11 = GetRemainingTimeAllowed(this), testTimeOut < dVar11)) {
    local_58 = testTimeOut;
  }
  if (local_58 <= 0.0) {
    local_58 = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar3 = std::operator<<((ostream *)local_1d0,"Test timeout computed to be: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
  std::operator<<(poVar3,"\n");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,4,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x52a,pcVar4,false);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
  pcVar4 = *ppcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_220,pcVar4,
             (allocator *)
             ((long)&inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar1 = cmsys::SystemTools::SameFile(&local_220,file2);
  local_160a = 0;
  if (bVar1) {
    local_160a = this->ForceNewCTestProcess ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&inst.Definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  if ((local_160a & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
    if (output != (string *)0x0) {
      std::__cxx11::string::operator=((string *)output,"");
    }
    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::auto_ptr
              ((auto_ptr<cmSystemTools::SaveRestoreEnvironment> *)&cp,(SaveRestoreEnvironment *)0x0)
    ;
    if ((local_15b9 & 1) != 0) {
      pSVar8 = (SaveRestoreEnvironment *)operator_new(0x20);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar8);
      cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset
                ((auto_ptr<cmSystemTools::SaveRestoreEnvironment> *)&cp,pSVar8);
      cmSystemTools::AppendEnv(environment);
    }
    cp_00 = cmsysProcess_New();
    local_d10 = cp_00;
    local_d18._M_current =
         (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(argv);
    command = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_d18);
    cmsysProcess_SetCommand(cp_00,command);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
    poVar3 = std::operator<<((ostream *)local_e90,"Command is: ");
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](argv,0);
    poVar3 = std::operator<<(poVar3,*ppcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x578,pcVar4,false);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
    bVar1 = cmSystemTools::GetRunCommandHideConsole();
    if (bVar1) {
      cmsysProcess_SetOption(local_d10,0,1);
    }
    cmsysProcess_SetTimeout(local_d10,local_58);
    cmsysProcess_Execute(local_d10);
    while (iVar2 = cmsysProcess_WaitForData
                             (local_d10,&stack0xfffffffffffff148,&local_ebc,(double *)0x0),
          iVar2 != 0) {
      if (output != (string *)0x0) {
        local_ed0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)&saveEnv);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_ec8,&local_ed0);
        std::vector<char,std::allocator<char>>::insert<char*,void>
                  ((vector<char,std::allocator<char>> *)&saveEnv,local_ec8,pcStack_eb8,
                   pcStack_eb8 + local_ebc);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1050);
      cmCTestLogWrite::cmCTestLogWrite(&local_1060,pcStack_eb8,(long)local_ebc);
      ::operator<<((ostream *)local_1050,&local_1060);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x589,pcVar4,false);
      std::__cxx11::string::~string(local_1080);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1050);
      if (log != (ostream *)0x0) {
        std::ostream::write((char *)log,(long)pcStack_eb8);
      }
    }
    cmsysProcess_WaitForExit(local_d10,(double *)0x0);
    local_16a1 = false;
    if (output != (string *)0x0) {
      local_1088._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_1090._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      local_16a1 = __gnu_cxx::operator!=(&local_1088,&local_1090);
    }
    if (local_16a1 != false) {
      local_1098._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)&saveEnv);
      pcVar9 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&local_1098);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)&saveEnv);
      std::__cxx11::string::append((char *)output,(ulong)pcVar9);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1210);
    poVar3 = std::operator<<((ostream *)local_1210,"-- Process completed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x596,pcVar4,false);
    std::__cxx11::string::~string(local_1230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1210);
    outerr.field_2._12_4_ = cmsysProcess_GetState(local_d10);
    if (outerr.field_2._12_4_ == 4) {
      iVar2 = cmsysProcess_GetExitValue(local_d10);
      *retVal = iVar2;
      if ((*retVal != 0) && ((this->OutputTestOutputOnTestFailure & 1U) != 0)) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
    }
    else if (outerr.field_2._12_4_ == 2) {
      if ((this->OutputTestOutputOnTestFailure & 1U) != 0) {
        OutputTestErrors(this,(vector<char,_std::allocator<char>_> *)&saveEnv);
      }
      iVar2 = cmsysProcess_GetExitException(local_d10);
      *retVal = iVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1258,"\n*** Exception executing: ",&local_1259);
      std::allocator<char>::~allocator((allocator<char> *)&local_1259);
      pcVar4 = cmsysProcess_GetExceptionString(local_d10);
      std::__cxx11::string::operator+=(local_1258,pcVar4);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_1258);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13d8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar3 = std::operator<<((ostream *)local_13d8,pcVar4);
      pvVar10 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar10,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x5b0,pcVar4,false);
      std::__cxx11::string::~string((string *)(outerr_1.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13d8);
      std::__cxx11::string::~string(local_1258);
    }
    else if (outerr.field_2._12_4_ == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1418,"\n*** ERROR executing: ",&local_1419);
      std::allocator<char>::~allocator((allocator<char> *)&local_1419);
      pcVar4 = cmsysProcess_GetErrorString(local_d10);
      std::__cxx11::string::operator+=(local_1418,pcVar4);
      if (output != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)output,local_1418);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1598);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar3 = std::operator<<((ostream *)local_1598,pcVar4);
      pvVar10 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar10,std::flush<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x5bb,pcVar4,false);
      std::__cxx11::string::~string(local_15b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1598);
      std::__cxx11::string::~string(local_1418);
    }
    cmsysProcess_Delete(local_d10);
    this_local._4_4_ = outerr.field_2._12_4_;
    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr
              ((auto_ptr<cmSystemTools::SaveRestoreEnvironment> *)&cp);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&saveEnv);
  }
  else {
    cmCTest((cmCTest *)local_788);
    std::__cxx11::string::operator=((string *)&inst,(string *)&this->ConfigType);
    inst.SpecificTrack.field_2._8_8_ = local_58;
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    out = &args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    SetStreams((cmCTest *)local_788,(ostream *)out,(ostream *)out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_918);
    for (local_91c = 0; uVar6 = (ulong)local_91c,
        sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(argv), uVar6 < sVar7;
        local_91c = local_91c + 1) {
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (argv,(ulong)local_91c);
      if (*ppcVar5 != (value_type)0x0) {
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (argv,(ulong)local_91c);
        iVar2 = strcmp(*ppcVar5,"--build-generator");
        if ((iVar2 == 0) && (0.0 < local_58)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_940,"--test-timeout",&local_941);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_918,&local_940);
          std::__cxx11::string::~string((string *)&local_940);
          std::allocator<char>::~allocator((allocator<char> *)&local_941);
          std::__cxx11::ostringstream::ostringstream(local_ac0);
          std::ostream::operator<<(local_ac0,local_58);
          std::__cxx11::ostringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_918,&local_ae0);
          std::__cxx11::string::~string((string *)&local_ae0);
          std::__cxx11::ostringstream::~ostringstream(local_ac0);
        }
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (argv,(ulong)local_91c);
        pcVar4 = *ppcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b00,pcVar4,(allocator *)(oldpath.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_918,&local_b00);
        std::__cxx11::string::~string((string *)&local_b00);
        std::allocator<char>::~allocator((allocator<char> *)(oldpath.field_2._M_local_buf + 0xf));
      }
    }
    collapse = extraout_DL;
    if (log != (ostream *)0x0) {
      poVar3 = std::operator<<(log,"* Run internal CTest");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      collapse = extraout_DL_00;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&saveEnv_1,(SystemTools *)0x1,(bool)collapse);
    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::auto_ptr
              (&local_b30,(SaveRestoreEnvironment *)0x0);
    if ((local_15b9 & 1) != 0) {
      pSVar8 = (SaveRestoreEnvironment *)operator_new(0x20);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar8);
      cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::reset(&local_b30,pSVar8);
      cmSystemTools::AppendEnv(environment);
    }
    iVar2 = Run((cmCTest *)local_788,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_918,output);
    *retVal = iVar2;
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=((string *)output,local_b50);
      std::__cxx11::string::~string(local_b50);
    }
    if ((log != (ostream *)0x0) && (output != (string *)0x0)) {
      std::operator<<(log,(string *)output);
    }
    cmsys::SystemTools::ChangeDirectory((string *)&saveEnv_1);
    if (output != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc8);
      poVar3 = std::operator<<((ostream *)local_cc8,"Internal cmCTest object used to run test.");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,(string *)output);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,4,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x564,pcVar4,false);
      std::__cxx11::string::~string
                ((string *)
                 &tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc8);
    }
    this_local._4_4_ = 4;
    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment>::~auto_ptr(&local_b30);
    std::__cxx11::string::~string((string *)&saveEnv_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_918);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ~cmCTest((cmCTest *)local_788);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv,
                     std::string* output, int *retVal,
                     std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout)
    {
    timeout = this->TimeOut;
    }
  if (testTimeOut > 0
      && testTimeOut < this->GetRemainingTimeAllowed())
    {
    timeout = testTimeOut;
    }

  // always have at least 1 second if we got to here
  if (timeout <= 0)
    {
    timeout = 1;
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if(cmSystemTools::SameFile(
       argv[0], cmSystemTools::GetCTestCommand()) &&
     !this->ForceNewCTestProcess)
    {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for(unsigned int i =0; i < argv.size(); ++i)
      {
      if(argv[i])
        {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i],"--build-generator") == 0 && timeout > 0)
          {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
          }
        args.push_back(argv[i]);
        }
      }
    if ( log )
      {
      *log << "* Run internal CTest" << std::endl;
      }
    std::string oldpath = cmSystemTools::GetCurrentWorkingDirectory();

    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv)
      {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
      }

    *retVal = inst.Run(args, output);
    if(output)
      {
      *output += oss.str();
      }
    if ( log && output)
      {
      *log << *output;
      }
    cmSystemTools::ChangeDirectory(oldpath);
    if(output)
      {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                 <<  *output << std::endl);
      }

    return cmsysProcess_State_Exited;
    }
  std::vector<char> tempOutput;
  if ( output )
    {
    *output = "";
    }

  cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv)
    {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    if ( output )
      {
      tempOutput.insert(tempOutput.end(), data, data+length);
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( log )
      {
      log->write(data, length);
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if(output && tempOutput.begin() != tempOutput.end())
    {
    output->append(&*tempOutput.begin(), tempOutput.size());
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
    << std::endl);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    if(*retVal != 0 && this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    }
  else if(result == cmsysProcess_State_Exception)
    {
    if(this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  else if(result == cmsysProcess_State_Error)
    {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  cmsysProcess_Delete(cp);

  return result;
}